

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QUtil.cc
# Opt level: O3

string * transcode_utf8(string *__return_storage_ptr__,string *utf8_val,encoding_e encoding,
                       char unknown)

{
  bool bVar1;
  undefined7 extraout_var;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  bVar1 = transcode_utf8(utf8_val,__return_storage_ptr__,encoding,unknown);
  return (string *)CONCAT71(extraout_var,bVar1);
}

Assistant:

static std::string
transcode_utf8(std::string const& utf8_val, encoding_e encoding, char unknown)
{
    std::string result;
    transcode_utf8(utf8_val, result, encoding, unknown);
    return result;
}